

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O2

void Js::JavascriptArray::InternalFillFromPrototype
               (JavascriptArray *dstArray,uint32 dstIndex,JavascriptArray *srcArray,uint32 start,
               uint32 end,uint32 count)

{
  code *pcVar1;
  uint index;
  undefined8 this;
  bool bVar2;
  BOOL BVar3;
  uint32 uVar4;
  int iVar5;
  undefined4 *puVar6;
  JavascriptArray *obj;
  void *value;
  DynamicObject *this_00;
  ArrayObject *obj_00;
  RecyclableObject *instance;
  anon_class_32_4_bca61903 local_e8;
  ScriptContext *local_c8;
  undefined1 local_c0 [8];
  ArrayElementEnumerator e;
  Var local_98;
  JavascriptArray *local_90;
  JavascriptArray *dstArray_local;
  Var oldValue;
  undefined1 local_78 [8];
  JsReentLock jsReentLock;
  uint32 local_48;
  uint32 local_44;
  uint32 dstIndex_local;
  uint32 count_local;
  uint32 local_34 [2];
  uint32 start_local;
  
  local_90 = dstArray;
  local_48 = dstIndex;
  local_44 = count;
  local_34[0] = start;
  oldValue = RecyclableObject::GetPrototype((RecyclableObject *)srcArray);
  puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  do {
    instance = (RecyclableObject *)oldValue;
    if ((count + start == end) ||
       (BVar3 = JavascriptOperators::IsNull((RecyclableObject *)oldValue), uVar4 = local_34[0],
       BVar3 != 0)) {
      return;
    }
    jsReentLock._24_8_ = local_90;
    _dstIndex_local = (ulong)local_48;
    local_e8.dstIndex = &local_48;
    local_e8.start = local_34;
    local_e8.dstArray = &local_90;
    local_e8.count = &local_44;
    local_78 = (undefined1  [8])
               ((((((srcArray->super_ArrayObject).super_DynamicObject.super_RecyclableObject.type.
                   ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr)->
               threadContext;
    jsReentLock.m_threadContext = (ThreadContext *)0x0;
    jsReentLock.m_arrayObject = (Var)0x0;
    jsReentLock.m_arrayObject2._0_1_ = ((ThreadContext *)local_78)->noJsReentrancy;
    ((ThreadContext *)local_78)->noJsReentrancy = true;
    JsReentLock::setObjectForMutation((JsReentLock *)local_78,srcArray);
    JsReentLock::setSecondObjectForMutation((JsReentLock *)local_78,(Var)jsReentLock._24_8_);
    bVar2 = DynamicObject::IsAnyArray(instance);
    if ((!bVar2) && (BVar3 = JavascriptOperators::IsObject(instance), BVar3 == 0)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *puVar6 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                  ,0x2a76,
                                  "(DynamicObject::IsAnyArray(obj) || JavascriptOperators::IsObject(obj))"
                                  ,
                                  "DynamicObject::IsAnyArray(obj) || JavascriptOperators::IsObject(obj)"
                                 );
      if (!bVar2) goto LAB_00a40792;
      *puVar6 = 0;
    }
    bVar2 = DynamicObject::IsAnyArray(instance);
    if (bVar2) {
      obj = UnsafeFromAnyArray(instance);
LAB_00a4047b:
      if (obj != (JavascriptArray *)0x0) {
        bVar2 = IsNonES5Array(obj);
        if (bVar2) {
          EnsureNonNativeArray(obj);
          ArrayElementEnumerator::ArrayElementEnumerator
                    ((ArrayElementEnumerator *)local_c0,obj,uVar4,end);
          this = jsReentLock._24_8_;
          _dstIndex_local = (ulong)((int)_dstIndex_local - uVar4);
LAB_00a404c3:
          do {
            bVar2 = ArrayElementEnumerator::MoveNext<void*>((ArrayElementEnumerator *)local_c0);
            if (!bVar2) goto LAB_00a4075b;
            uVar4 = ArrayElementEnumerator::GetIndex((ArrayElementEnumerator *)local_c0);
            iVar5 = (*(srcArray->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
                      super_FinalizableObject.super_IRecyclerVisitedObject.
                      _vptr_IRecyclerVisitedObject[0x70])
                              (srcArray,(ulong)uVar4,&dstArray_local,
                               (((((srcArray->super_ArrayObject).super_DynamicObject.
                                   super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)->
                               super_JavascriptLibraryBase).scriptContext.ptr);
            if (iVar5 == 0) {
              if (this != 0) {
                BVar3 = DirectGetItemAt<void*>
                                  ((JavascriptArray *)this,uVar4 + dstIndex_local,&dstArray_local);
                if (BVar3 != 0) goto LAB_00a404c3;
              }
              *(undefined1 *)((long)local_78 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
              value = ArrayElementEnumerator::GetItem<void*>((ArrayElementEnumerator *)local_c0);
              InternalFillFromPrototype::anon_class_32_4_bca61903::operator()(&local_e8,uVar4,value)
              ;
              JsReentLock::MutateArrayObject((JsReentLock *)local_78);
              *(bool *)((long)local_78 + 0x108) = true;
            }
          } while( true );
        }
        local_c8 = *(ScriptContext **)(*(long *)(*(long *)((long)instance + 8) + 8) + 0x490);
        bVar2 = VarIsImpl<Js::ES5Array>((RecyclableObject *)obj);
        if (!bVar2) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *puVar6 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                      ,0x2a9d,"(VarIs<ES5Array>(arr))","VarIs<ES5Array>(arr)");
          if (!bVar2) {
LAB_00a40792:
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          *puVar6 = 0;
        }
        local_c0 = (undefined1  [8])VarTo<Js::ES5Array,Js::JavascriptArray>(obj);
        e.seg._0_4_ = ((SparseArraySegmentBase *)((long)local_c0 + 0x18))->size;
        e._4_8_ = 0xffffffffffffffff;
        e.endIndex = 0xffffffff;
        e.start = 0;
        e.end = 0;
        _dstIndex_local = (ulong)((int)_dstIndex_local - uVar4);
        while (bVar2 = ES5ArrayIndexStaticEnumerator<true>::MoveNext
                                 ((ES5ArrayIndexStaticEnumerator<true> *)local_c0,
                                  (PropertyAttributes *)0x0), bVar2) {
          index = e.seg._4_4_;
          if (uVar4 <= e.seg._4_4_) {
            if (end <= e.seg._4_4_) break;
            iVar5 = (*(srcArray->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
                      super_FinalizableObject.super_IRecyclerVisitedObject.
                      _vptr_IRecyclerVisitedObject[0x70])
                              (srcArray,e._4_8_ & 0xffffffff,&dstArray_local,
                               (((((srcArray->super_ArrayObject).super_DynamicObject.
                                   super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)->
                               super_JavascriptLibraryBase).scriptContext.ptr);
            if ((iVar5 == 0) &&
               ((jsReentLock._24_8_ == 0 ||
                (BVar3 = DirectGetItemAt<void*>
                                   ((JavascriptArray *)jsReentLock._24_8_,
                                    (int)_dstIndex_local + index,&dstArray_local), BVar3 == 0)))) {
              local_98 = (Var)0x0;
              *(undefined1 *)((long)local_78 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
              BVar3 = JavascriptOperators::GetOwnItem(instance,index,&local_98,local_c8);
              JsReentLock::MutateArrayObject((JsReentLock *)local_78);
              *(bool *)((long)local_78 + 0x108) = true;
              instance = (RecyclableObject *)oldValue;
              if (BVar3 != 0) {
                *(undefined1 *)((long)local_78 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
                InternalFillFromPrototype::anon_class_32_4_bca61903::operator()
                          (&local_e8,index,local_98);
                JsReentLock::MutateArrayObject((JsReentLock *)local_78);
                *(bool *)((long)local_78 + 0x108) = true;
                instance = (RecyclableObject *)oldValue;
              }
            }
          }
        }
      }
    }
    else {
      bVar2 = DynamicType::Is(**(TypeId **)((long)instance + 8));
      if (bVar2) {
        this_00 = UnsafeVarTo<Js::DynamicObject,Js::RecyclableObject>(instance);
        obj_00 = DynamicObject::GetObjectArray(this_00);
        if ((obj_00 != (ArrayObject *)0x0) &&
           (bVar2 = DynamicObject::IsAnyArray(&obj_00->super_DynamicObject), bVar2)) {
          obj = UnsafeFromAnyArray(obj_00);
          goto LAB_00a4047b;
        }
      }
    }
LAB_00a4075b:
    *(undefined1 *)((long)local_78 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
    oldValue = RecyclableObject::GetPrototype(instance);
    count = local_44;
    start = local_34[0];
  } while( true );
}

Assistant:

void JavascriptArray::InternalFillFromPrototype(JavascriptArray *dstArray, uint32 dstIndex, JavascriptArray *srcArray, uint32 start, uint32 end, uint32 count)
    {
        RecyclableObject* prototype = srcArray->GetPrototype();
        while (start + count != end && !JavascriptOperators::IsNull(prototype))
        {
            ForEachOwnMissingArrayIndexOfObject(srcArray, dstArray, prototype, start, end, dstIndex, [&](uint32 index, Var value) {
                uint32 n = dstIndex + (index - start);
                dstArray->SetItem(n, value, PropertyOperation_None);

                count++;
            });

            prototype = prototype->GetPrototype();
        }
    }